

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

bool __thiscall cmComputeTargetDepends::Compute(cmComputeTargetDepends *this)

{
  bool bVar1;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  undefined1 local_240 [8];
  cmComputeComponentGraph ccg2;
  string local_158;
  undefined4 local_134;
  undefined1 local_130 [8];
  cmComputeComponentGraph ccg1;
  allocator<char> local_39;
  string local_38;
  cmComputeTargetDepends *local_18;
  cmComputeTargetDepends *this_local;
  
  local_18 = this;
  CollectTargets(this);
  CollectDepends(this);
  if ((this->DebugMode & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"initial",&local_39);
    DisplayGraph(this,&this->InitialGraph,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  cmComputeComponentGraph::cmComputeComponentGraph
            ((cmComputeComponentGraph *)local_130,&this->InitialGraph);
  cmComputeComponentGraph::Compute((cmComputeComponentGraph *)local_130);
  bVar1 = CheckComponents(this,(cmComputeComponentGraph *)local_130);
  if (bVar1) {
    CollectSideEffects(this);
    ComputeIntermediateGraph(this);
    if ((this->DebugMode & 1U) != 0) {
      DisplaySideEffects(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"intermediate",
                 (allocator<char> *)((long)&ccg2.TarjanIndex + 7));
      DisplayGraph(this,&this->IntermediateGraph,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ccg2.TarjanIndex + 7));
    }
    cmComputeComponentGraph::cmComputeComponentGraph
              ((cmComputeComponentGraph *)local_240,&this->IntermediateGraph);
    cmComputeComponentGraph::Compute((cmComputeComponentGraph *)local_240);
    if ((this->DebugMode & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_260,"intermediate",&local_261);
      DisplayComponents(this,(cmComputeComponentGraph *)local_240,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::allocator<char>::~allocator(&local_261);
    }
    bVar1 = CheckComponents(this,(cmComputeComponentGraph *)local_240);
    if (bVar1) {
      bVar1 = ComputeFinalDepends(this,(cmComputeComponentGraph *)local_240);
      if (bVar1) {
        if ((this->DebugMode & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_288,"final",&local_289);
          DisplayGraph(this,&this->FinalGraph,&local_288);
          std::__cxx11::string::~string((string *)&local_288);
          std::allocator<char>::~allocator(&local_289);
        }
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
    local_134 = 1;
    cmComputeComponentGraph::~cmComputeComponentGraph((cmComputeComponentGraph *)local_240);
  }
  else {
    this_local._7_1_ = 0;
    local_134 = 1;
  }
  cmComputeComponentGraph::~cmComputeComponentGraph((cmComputeComponentGraph *)local_130);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmComputeTargetDepends::Compute()
{
  // Build the original graph.
  this->CollectTargets();
  this->CollectDepends();
  if (this->DebugMode) {
    this->DisplayGraph(this->InitialGraph, "initial");
  }
  cmComputeComponentGraph ccg1(this->InitialGraph);
  ccg1.Compute();
  if (!this->CheckComponents(ccg1)) {
    return false;
  }

  // Compute the intermediate graph.
  this->CollectSideEffects();
  this->ComputeIntermediateGraph();
  if (this->DebugMode) {
    this->DisplaySideEffects();
    this->DisplayGraph(this->IntermediateGraph, "intermediate");
  }

  // Identify components.
  cmComputeComponentGraph ccg2(this->IntermediateGraph);
  ccg2.Compute();
  if (this->DebugMode) {
    this->DisplayComponents(ccg2, "intermediate");
  }
  if (!this->CheckComponents(ccg2)) {
    return false;
  }

  // Compute the final dependency graph.
  if (!this->ComputeFinalDepends(ccg2)) {
    return false;
  }
  if (this->DebugMode) {
    this->DisplayGraph(this->FinalGraph, "final");
  }

  return true;
}